

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O1

void Ivy_ObjCollectFanouts(Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vArray)

{
  uint uVar1;
  void **ppvVar2;
  long lVar3;
  int iVar4;
  Ivy_Obj_t *pIVar5;
  
  if (p->fFanout == 0) {
    __assert_fail("p->fFanout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                  ,0x109,"void Ivy_ObjCollectFanouts(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                  ,0x10a,"void Ivy_ObjCollectFanouts(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  vArray->nSize = 0;
  pIVar5 = pObj->pFanout;
  do {
    if (pIVar5 == (Ivy_Obj_t *)0x0) {
      return;
    }
    uVar1 = vArray->nCap;
    if (vArray->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vArray->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc(0x80);
        }
        else {
          ppvVar2 = (void **)realloc(vArray->pArray,0x80);
        }
        vArray->pArray = ppvVar2;
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar1 * 2;
        if (iVar4 <= (int)uVar1) goto LAB_0074ebd6;
        if (vArray->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar2 = (void **)realloc(vArray->pArray,(ulong)uVar1 << 4);
        }
        vArray->pArray = ppvVar2;
      }
      vArray->nCap = iVar4;
    }
LAB_0074ebd6:
    iVar4 = vArray->nSize;
    vArray->nSize = iVar4 + 1;
    vArray->pArray[iVar4] = pIVar5;
    if (((ulong)pIVar5 & 1) != 0) {
      __assert_fail("!Ivy_IsComplement(pFanout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                    ,0x22,"Ivy_Obj_t *Ivy_ObjNextFanout(Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    if ((Ivy_Obj_t *)((ulong)pIVar5->pFanin0 & 0xfffffffffffffffe) == pObj) {
      lVar3 = 0x28;
    }
    else {
      lVar3 = 0x30;
      if ((Ivy_Obj_t *)((ulong)pIVar5->pFanin1 & 0xfffffffffffffffe) != pObj) {
        __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                      ,0x27,"Ivy_Obj_t *Ivy_ObjNextFanout(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
    }
    pIVar5 = *(Ivy_Obj_t **)((long)&pIVar5->Id + lVar3);
  } while( true );
}

Assistant:

void Ivy_ObjCollectFanouts( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vArray )
{
    Ivy_Obj_t * pFanout;
    assert( p->fFanout );
    assert( !Ivy_IsComplement(pObj) );
    Vec_PtrClear( vArray );
    Ivy_ObjForEachFanoutInt( pObj, pFanout )
        Vec_PtrPush( vArray, pFanout );
}